

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileConnections.hpp
# Opt level: O2

void helics::fileops::makeConnectionsToml<helics::CoreBroker>(CoreBroker *brk,string *file)

{
  value *pvVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_type sVar4;
  _Hash_node_base _Var5;
  _Hash_node_base *p_Var6;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar7;
  array_type *paVar8;
  string_type *psVar9;
  table_type *ptVar10;
  CoreBroker *pCVar11;
  string *psVar12;
  char *in_R9;
  basic_value<toml::type_config> *val;
  pointer pbVar13;
  __node_base *p_Var14;
  string_view publication;
  string_view source;
  string_view filter;
  string_view valueName;
  string_view valueName_00;
  string_view interfaceKey;
  string_view interfaceKey_00;
  string_view input;
  anon_class_16_2_4418202b callback;
  anon_class_16_2_4418055b callback_00;
  anon_class_16_2_4418055b callback_01;
  anon_class_16_2_4417f657 callback_02;
  anon_class_16_2_4417f657 callback_03;
  string_view target;
  anon_class_16_2_4418202b callback_04;
  anon_class_16_2_4418055b callback_05;
  anon_class_16_2_4418055b callback_06;
  anon_class_16_2_4417f657 callback_07;
  anon_class_16_2_4417f657 callback_08;
  string_view endpoint;
  anon_class_16_2_d8a696df callback_09;
  anon_class_16_2_d8a696df callback_10;
  anon_class_16_2_d8a696df callback_11;
  anon_class_16_2_d8a696df callback_12;
  anon_class_16_2_d8a696df callback_13;
  string_view value;
  string_view value_00;
  string_view alias;
  string_view alias_00;
  string_view defVal;
  string_view defVal_00;
  string_view defVal_01;
  string_view defVal_02;
  string_view defVal_03;
  string_view defVal_04;
  string_view defVal_05;
  allocator<char> local_7d1;
  undefined1 local_7d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b0;
  undefined1 local_7a0 [24];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> aliases;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> globals;
  undefined1 local_5f8 [64];
  undefined1 local_5b8 [64];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> filts;
  undefined1 local_4b0 [64];
  undefined1 local_470 [64];
  undefined1 local_430 [64];
  undefined1 local_3f0 [64];
  undefined1 local_3b0 [64];
  undefined1 local_370 [32];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> lnks;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> conns;
  value doc;
  value uVal;
  
  toml::basic_value<toml::type_config>::basic_value(&uVal);
  toml::basic_value<toml::type_config>::basic_value(&doc);
  loadToml(&conns,(string *)file);
  toml::basic_value<toml::type_config>::operator=(&doc,&conns);
  toml::basic_value<toml::type_config>::~basic_value(&conns);
  peVar7 = toml::find_or<toml::type_config,char[12]>(&doc,(char (*) [12])0x39580c,&uVal);
  toml::basic_value<toml::type_config>::basic_value(&conns,peVar7);
  if (conns.type_ != empty) {
    paVar8 = toml::basic_value<toml::type_config>::as_array(&conns);
    pbVar13 = (paVar8->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (paVar8->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      pCVar11 = (CoreBroker *)&globals;
      pvVar1 = (value *)(local_5b8 + 0x20);
      if (pbVar13 == pbVar2) break;
      if (pbVar13->type_ == array) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar9->_M_dataplus)._M_p;
        sVar4 = psVar9->_M_string_length;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        publication._M_str = pcVar3;
        publication._M_len = sVar4;
        input._M_str = (psVar9->_M_dataplus)._M_p;
        input._M_len = psVar9->_M_string_length;
        CoreBroker::dataLink(brk,publication,input);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&filts,"publication",(allocator<char> *)&aliases);
        psVar12 = (string *)((long)&globals.field_1 + 8);
        globals.field_1.integer_.value = 0;
        globals.field_1.integer_.format.fmt = dec;
        defVal._M_str = in_R9;
        defVal._M_len = (size_t)psVar12;
        globals._0_8_ = psVar12;
        getOrDefault((string *)&lnks,(fileops *)pbVar13,(value *)&filts,(string *)0x0,defVal);
        std::__cxx11::string::~string((string *)pCVar11);
        std::__cxx11::string::~string((string *)&filts);
        if (lnks.field_1.integer_.value == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pCVar11,"input",(allocator<char> *)local_7d0);
          psVar12 = (string *)((long)&aliases.field_1 + 8);
          aliases.field_1.integer_.value = 0;
          aliases.field_1.integer_.format.fmt = dec;
          defVal_00._M_str = in_R9;
          defVal_00._M_len = (size_t)psVar12;
          aliases._0_8_ = psVar12;
          getOrDefault((string *)&filts,(fileops *)pbVar13,(value *)pCVar11,(string *)0x0,defVal_00)
          ;
          std::__cxx11::string::~string((string *)&aliases);
          std::__cxx11::string::~string((string *)pCVar11);
          if (filts.field_1.integer_.value == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&aliases,"endpoint",(allocator<char> *)local_7b0._M_local_buf);
            psVar12 = (string *)(local_7d0 + 0x10);
            local_7d0._8_8_ = 0;
            local_7d0[0x10] = dec;
            defVal_01._M_str = in_R9;
            defVal_01._M_len = (size_t)psVar12;
            local_7d0._0_8_ = psVar12;
            getOrDefault((string *)pCVar11,(fileops *)pbVar13,&aliases,(string *)0x0,defVal_01);
            std::__cxx11::string::~string((string *)local_7d0);
            std::__cxx11::string::~string((string *)&aliases);
            if (globals.field_1.integer_.value != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)pvVar1,"targets",(allocator<char> *)&aliases);
              callback_02.ept = psVar12;
              callback_02.brk = pCVar11;
              addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_4_>
                        ((helics *)pbVar13,pvVar1,(string *)brk,callback_02);
              std::__cxx11::string::~string((string *)pvVar1);
              pvVar1 = (value *)(local_3f0 + 0x20);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)pvVar1,"sources",(allocator<char> *)&aliases);
              callback_03.ept = psVar12;
              callback_03.brk = pCVar11;
              addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_5_>
                        ((helics *)pbVar13,pvVar1,(string *)brk,callback_03);
              std::__cxx11::string::~string((string *)pvVar1);
            }
          }
          else {
            pvVar1 = (value *)(local_3b0 + 0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)pvVar1,"targets",(allocator<char> *)pCVar11);
            callback_00.ipt = psVar12;
            callback_00.brk = (CoreBroker *)&filts;
            addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_2_>
                      ((helics *)pbVar13,pvVar1,(string *)brk,callback_00);
            std::__cxx11::string::~string((string *)pvVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_3b0,"sources",(allocator<char> *)pCVar11);
            callback_01.ipt = psVar12;
            callback_01.brk = (CoreBroker *)&filts;
            addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_3_>
                      ((helics *)pbVar13,(value *)local_3b0,(string *)brk,callback_01);
            pCVar11 = (CoreBroker *)local_3b0;
          }
          std::__cxx11::string::~string((string *)pCVar11);
          pCVar11 = (CoreBroker *)&filts;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_370,"targets",(allocator<char> *)&filts);
          callback.pub = psVar12;
          callback.brk = (CoreBroker *)&lnks;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>
                    ((helics *)pbVar13,(value *)local_370,(string *)brk,callback);
          pCVar11 = (CoreBroker *)local_370;
        }
        std::__cxx11::string::~string((string *)pCVar11);
        std::__cxx11::string::~string((string *)&lnks);
      }
      pbVar13 = pbVar13 + 1;
    }
  }
  peVar7 = toml::find_or<toml::type_config,char[6]>(&doc,(char (*) [6])"links",&uVal);
  toml::basic_value<toml::type_config>::basic_value(&lnks,peVar7);
  if (lnks.type_ != empty) {
    paVar8 = toml::basic_value<toml::type_config>::as_array(&lnks);
    pbVar13 = (paVar8->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (paVar8->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      pCVar11 = (CoreBroker *)&aliases;
      if (pbVar13 == pbVar2) break;
      if (pbVar13->type_ == array) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar9->_M_dataplus)._M_p;
        sVar4 = psVar9->_M_string_length;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        source._M_str = pcVar3;
        source._M_len = sVar4;
        target._M_str = (psVar9->_M_dataplus)._M_p;
        target._M_len = psVar9->_M_string_length;
        CoreBroker::linkEndpoints(brk,source,target);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&globals,"publication",(allocator<char> *)local_7d0);
        psVar12 = (string *)((long)&aliases.field_1 + 8);
        aliases.field_1.integer_.value = 0;
        aliases.field_1.integer_.format.fmt = dec;
        defVal_02._M_str = in_R9;
        defVal_02._M_len = (size_t)psVar12;
        aliases._0_8_ = psVar12;
        getOrDefault((string *)&filts,(fileops *)pbVar13,(value *)&globals,(string *)0x0,defVal_02);
        std::__cxx11::string::~string((string *)pCVar11);
        std::__cxx11::string::~string((string *)&globals);
        if (filts.field_1.integer_.value == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pCVar11,"input",(allocator<char> *)local_7b0._M_local_buf);
          psVar12 = (string *)(local_7d0 + 0x10);
          local_7d0._8_8_ = 0;
          local_7d0[0x10] = dec;
          defVal_03._M_str = in_R9;
          defVal_03._M_len = (size_t)psVar12;
          local_7d0._0_8_ = psVar12;
          getOrDefault((string *)&globals,(fileops *)pbVar13,(value *)pCVar11,(string *)0x0,
                       defVal_03);
          std::__cxx11::string::~string((string *)local_7d0);
          std::__cxx11::string::~string((string *)pCVar11);
          if (globals.field_1.integer_.value == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_7d0,"endpoint",&local_7d1);
            psVar12 = (string *)local_7a0;
            local_7b0._8_8_ = 0;
            local_7a0[0] = 0;
            defVal_04._M_str = in_R9;
            defVal_04._M_len = (size_t)psVar12;
            local_7b0._M_allocated_capacity = (size_type)psVar12;
            getOrDefault((string *)pCVar11,(fileops *)pbVar13,(value *)local_7d0,(string *)0x0,
                         defVal_04);
            std::__cxx11::string::~string((string *)local_7b0._M_local_buf);
            std::__cxx11::string::~string((string *)local_7d0);
            if (aliases.field_1.integer_.value != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_5b8,"targets",(allocator<char> *)local_7d0);
              callback_07.ept = psVar12;
              callback_07.brk = pCVar11;
              addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_9_>
                        ((helics *)pbVar13,(value *)local_5b8,(string *)brk,callback_07);
              std::__cxx11::string::~string((string *)local_5b8);
              pvVar1 = (value *)(local_470 + 0x20);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)pvVar1,"sources",(allocator<char> *)local_7d0);
              callback_08.ept = psVar12;
              callback_08.brk = pCVar11;
              addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_10_>
                        ((helics *)pbVar13,pvVar1,(string *)brk,callback_08);
              std::__cxx11::string::~string((string *)pvVar1);
            }
          }
          else {
            pvVar1 = (value *)(local_430 + 0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)pvVar1,"targets",(allocator<char> *)pCVar11);
            callback_05.ipt = psVar12;
            callback_05.brk = (CoreBroker *)&globals;
            addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_7_>
                      ((helics *)pbVar13,pvVar1,(string *)brk,callback_05);
            std::__cxx11::string::~string((string *)pvVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_430,"sources",(allocator<char> *)pCVar11);
            callback_06.ipt = psVar12;
            callback_06.brk = (CoreBroker *)&globals;
            addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_8_>
                      ((helics *)pbVar13,(value *)local_430,(string *)brk,callback_06);
            pCVar11 = (CoreBroker *)local_430;
          }
          std::__cxx11::string::~string((string *)pCVar11);
          pCVar11 = (CoreBroker *)&globals;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3f0,"targets",(allocator<char> *)&globals);
          callback_04.pub = psVar12;
          callback_04.brk = (CoreBroker *)&filts;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_6_>
                    ((helics *)pbVar13,(value *)local_3f0,(string *)brk,callback_04);
          pCVar11 = (CoreBroker *)local_3f0;
        }
        std::__cxx11::string::~string((string *)pCVar11);
        std::__cxx11::string::~string((string *)&filts);
      }
      pbVar13 = pbVar13 + 1;
    }
  }
  peVar7 = toml::find_or<toml::type_config,char[8]>(&doc,(char (*) [8])0x39b2de,&uVal);
  toml::basic_value<toml::type_config>::basic_value(&filts,peVar7);
  if (filts.type_ != empty) {
    paVar8 = toml::basic_value<toml::type_config>::as_array(&filts);
    pbVar13 = (paVar8->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_7a0._16_8_ =
         (paVar8->
         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      pvVar1 = (value *)(local_5f8 + 0x20);
      if (pbVar13 == (pointer)local_7a0._16_8_) break;
      if (pbVar13->type_ == array) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar9->_M_dataplus)._M_p;
        sVar4 = psVar9->_M_string_length;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        filter._M_str = pcVar3;
        filter._M_len = sVar4;
        endpoint._M_str = (psVar9->_M_dataplus)._M_p;
        endpoint._M_len = psVar9->_M_string_length;
        CoreBroker::addSourceFilterToEndpoint(brk,filter,endpoint);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&aliases,"filter",(allocator<char> *)local_7b0._M_local_buf);
        psVar12 = (string *)(local_7d0 + 0x10);
        local_7d0._8_8_ = 0;
        local_7d0[0x10] = dec;
        defVal_05._M_str = in_R9;
        defVal_05._M_len = (size_t)psVar12;
        local_7d0._0_8_ = psVar12;
        getOrDefault((string *)&globals,(fileops *)pbVar13,&aliases,(string *)0x0,defVal_05);
        std::__cxx11::string::~string((string *)local_7d0);
        std::__cxx11::string::~string((string *)&aliases);
        if (globals.field_1.integer_.value != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pvVar1,"endpoints",(allocator<char> *)&aliases);
          callback_09.fname = psVar12;
          callback_09.brk = (CoreBroker *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    ((helics *)pbVar13,pvVar1,(string *)brk,callback_09);
          std::__cxx11::string::~string((string *)pvVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_470,"source_endpoints",(allocator<char> *)&aliases);
          callback_10.fname = psVar12;
          callback_10.brk = (CoreBroker *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    ((helics *)pbVar13,(value *)local_470,(string *)brk,callback_10);
          std::__cxx11::string::~string((string *)local_470);
          pvVar1 = (value *)(local_4b0 + 0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pvVar1,"sourceEndpoints",(allocator<char> *)&aliases);
          callback_11.fname = psVar12;
          callback_11.brk = (CoreBroker *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    ((helics *)pbVar13,pvVar1,(string *)brk,callback_11);
          std::__cxx11::string::~string((string *)pvVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4b0,"dest_endpoints",(allocator<char> *)&aliases);
          callback_12.fname = psVar12;
          callback_12.brk = (CoreBroker *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_12_>
                    ((helics *)pbVar13,(value *)local_4b0,(string *)brk,callback_12);
          std::__cxx11::string::~string((string *)local_4b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_5f8,"destEndpoints",(allocator<char> *)&aliases);
          callback_13.fname = psVar12;
          callback_13.brk = (CoreBroker *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_12_>
                    ((helics *)pbVar13,(value *)local_5f8,(string *)brk,callback_13);
          std::__cxx11::string::~string((string *)local_5f8);
        }
        std::__cxx11::string::~string((string *)&globals);
      }
      pbVar13 = pbVar13 + 1;
    }
  }
  peVar7 = toml::find_or<toml::type_config,char[8]>(&doc,(char (*) [8])"globals",&uVal);
  toml::basic_value<toml::type_config>::basic_value(&globals,peVar7);
  if (globals.type_ != empty) {
    if (globals.type_ == array) {
      paVar8 = toml::basic_value<toml::type_config>::as_array(&globals);
      pbVar2 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = (paVar8->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar2;
          pbVar13 = pbVar13 + 1) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar9->_M_dataplus)._M_p;
        sVar4 = psVar9->_M_string_length;
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        valueName._M_str = pcVar3;
        valueName._M_len = sVar4;
        value._M_str = (psVar9->_M_dataplus)._M_p;
        value._M_len = psVar9->_M_string_length;
        CoreBroker::setGlobal(brk,valueName,value);
      }
    }
    else {
      ptVar10 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(&globals);
      p_Var14 = &(ptVar10->_M_h)._M_before_begin;
      while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
        _Var5._M_nxt = p_Var14[1]._M_nxt;
        p_Var6 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var14 + 2))->_M_max_load_factor;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((basic_value<toml::type_config> *)(p_Var14 + 5));
        valueName_00._M_str = (char *)_Var5._M_nxt;
        valueName_00._M_len = (size_t)p_Var6;
        value_00._M_str = (psVar9->_M_dataplus)._M_p;
        value_00._M_len = psVar9->_M_string_length;
        CoreBroker::setGlobal(brk,valueName_00,value_00);
      }
    }
  }
  peVar7 = toml::find_or<toml::type_config,char[8]>(&doc,(char (*) [8])"aliases",&uVal);
  toml::basic_value<toml::type_config>::basic_value(&aliases,peVar7);
  if (aliases.type_ != empty) {
    if (aliases.type_ == array) {
      paVar8 = toml::basic_value<toml::type_config>::as_array(&aliases);
      pbVar2 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = (paVar8->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar2;
          pbVar13 = pbVar13 + 1) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar9->_M_dataplus)._M_p;
        sVar4 = psVar9->_M_string_length;
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        interfaceKey._M_str = pcVar3;
        interfaceKey._M_len = sVar4;
        alias._M_str = (psVar9->_M_dataplus)._M_p;
        alias._M_len = psVar9->_M_string_length;
        CoreBroker::addAlias(brk,interfaceKey,alias);
      }
    }
    else {
      ptVar10 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(&aliases);
      p_Var14 = &(ptVar10->_M_h)._M_before_begin;
      while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
        _Var5._M_nxt = p_Var14[1]._M_nxt;
        p_Var6 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var14 + 2))->_M_max_load_factor;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((basic_value<toml::type_config> *)(p_Var14 + 5));
        interfaceKey_00._M_str = (char *)_Var5._M_nxt;
        interfaceKey_00._M_len = (size_t)p_Var6;
        alias_00._M_str = (psVar9->_M_dataplus)._M_p;
        alias_00._M_len = psVar9->_M_string_length;
        CoreBroker::addAlias(brk,interfaceKey_00,alias_00);
      }
    }
  }
  toml::basic_value<toml::type_config>::~basic_value(&aliases);
  toml::basic_value<toml::type_config>::~basic_value(&globals);
  toml::basic_value<toml::type_config>::~basic_value(&filts);
  toml::basic_value<toml::type_config>::~basic_value(&lnks);
  toml::basic_value<toml::type_config>::~basic_value(&conns);
  toml::basic_value<toml::type_config>::~basic_value(&doc);
  toml::basic_value<toml::type_config>::~basic_value(&uVal);
  return;
}

Assistant:

void makeConnectionsToml(brkX* brk, const std::string& file)
{
    toml::value uVal;
    static_assert(std::is_base_of<Broker, brkX>::value || std::is_base_of<Core, brkX>::value,
                  "broker must be Core or broker");
    toml::value doc;
    try {
        doc = loadToml(file);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }

    auto conns = toml::find_or(doc, "connections", uVal);
    if (!conns.is_empty()) {
        auto& connArray = conns.as_array();
        for (const auto& conn : connArray) {
            if (conn.is_array()) {
                auto& connAct = conn.as_array();
                brk->dataLink(connAct[0].as_string(), connAct[1].as_string());
            } else {
                std::string pub = getOrDefault(conn, "publication", std::string());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](const std::string& target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](const std::string& target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](const std::string& source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](const std::string& target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](const std::string& source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    auto lnks = toml::find_or(doc, "links", uVal);
    if (!lnks.is_empty()) {
        auto& connArray = lnks.as_array();
        for (const auto& conn : connArray) {
            if (conn.is_array()) {
                auto& connAct = conn.as_array();
                brk->linkEndpoints(connAct[0].as_string(), connAct[1].as_string());
            } else {
                std::string pub = getOrDefault(conn, "publication", std::string());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](const std::string& target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](const std::string& target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](const std::string& source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](const std::string& target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](const std::string& source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    auto filts = toml::find_or(doc, "filters", uVal);
    if (!filts.is_empty()) {
        auto& filtArray = filts.as_array();
        for (const auto& filt : filtArray) {
            if (filt.is_array()) {
                auto& filtAct = filt.as_array();
                brk->addSourceFilterToEndpoint(filtAct[0].as_string(), filtAct[1].as_string());
            } else {
                std::string fname = getOrDefault(filt, "filter", std::string());
                if (!fname.empty()) {
                    auto asrc = [brk, &fname](const std::string& ept) {
                        brk->addSourceFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "endpoints", asrc);
                    addTargets(filt, "source_endpoints", asrc);
                    addTargets(filt, "sourceEndpoints", asrc);
                    auto adst = [brk, &fname](const std::string& ept) {
                        brk->addDestinationFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "dest_endpoints", adst);
                    addTargets(filt, "destEndpoints", adst);
                }
            }
        }
    }
    auto globals = toml::find_or(doc, "globals", uVal);
    if (!globals.is_empty()) {
        if (globals.is_array()) {
            for (auto& val : globals.as_array()) {
                brk->setGlobal(val.as_array()[0].as_string(), val.as_array()[1].as_string());
            }
        } else {
            for (const auto& val : globals.as_table()) {
                brk->setGlobal(val.first, val.second.as_string());
            }
        }
    }
    auto aliases = toml::find_or(doc, "aliases", uVal);
    if (!aliases.is_empty()) {
        if (aliases.is_array()) {
            for (auto& val : aliases.as_array()) {
                brk->addAlias(val.as_array()[0].as_string(), val.as_array()[1].as_string());
            }
        } else {
            for (const auto& val : aliases.as_table()) {
                brk->addAlias(val.first, val.second.as_string());
            }
        }
    }
}